

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv_getrusage(uv_rusage_t *rusage)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  rusage usage;
  rusage local_a0;
  
  iVar3 = 0;
  iVar1 = getrusage(RUSAGE_SELF,&local_a0);
  if (iVar1 == 0) {
    (rusage->ru_utime).tv_sec = local_a0.ru_utime.tv_sec;
    (rusage->ru_utime).tv_usec = local_a0.ru_utime.tv_usec;
    (rusage->ru_stime).tv_sec = local_a0.ru_stime.tv_sec;
    (rusage->ru_stime).tv_usec = local_a0.ru_stime.tv_usec;
    rusage->ru_maxrss = local_a0.ru_maxrss;
    rusage->ru_ixrss = local_a0.ru_ixrss;
    rusage->ru_idrss = local_a0.ru_idrss;
    rusage->ru_isrss = local_a0.ru_isrss;
    rusage->ru_minflt = local_a0.ru_minflt;
    rusage->ru_majflt = local_a0.ru_majflt;
    rusage->ru_nswap = local_a0.ru_nswap;
    rusage->ru_inblock = local_a0.ru_inblock;
    rusage->ru_oublock = local_a0.ru_oublock;
    rusage->ru_msgsnd = local_a0.ru_msgsnd;
    rusage->ru_msgrcv = local_a0.ru_msgrcv;
    rusage->ru_nsignals = local_a0.ru_nsignals;
    rusage->ru_nvcsw = local_a0.ru_nvcsw;
    rusage->ru_nivcsw = local_a0.ru_nivcsw;
  }
  else {
    piVar2 = __errno_location();
    iVar3 = -*piVar2;
  }
  return iVar3;
}

Assistant:

int uv_getrusage(uv_rusage_t* rusage) {
  struct rusage usage;

  if (getrusage(RUSAGE_SELF, &usage))
    return UV__ERR(errno);

  rusage->ru_utime.tv_sec = usage.ru_utime.tv_sec;
  rusage->ru_utime.tv_usec = usage.ru_utime.tv_usec;

  rusage->ru_stime.tv_sec = usage.ru_stime.tv_sec;
  rusage->ru_stime.tv_usec = usage.ru_stime.tv_usec;

#if !defined(__MVS__) && !defined(__HAIKU__)
  rusage->ru_maxrss = usage.ru_maxrss;
  rusage->ru_ixrss = usage.ru_ixrss;
  rusage->ru_idrss = usage.ru_idrss;
  rusage->ru_isrss = usage.ru_isrss;
  rusage->ru_minflt = usage.ru_minflt;
  rusage->ru_majflt = usage.ru_majflt;
  rusage->ru_nswap = usage.ru_nswap;
  rusage->ru_inblock = usage.ru_inblock;
  rusage->ru_oublock = usage.ru_oublock;
  rusage->ru_msgsnd = usage.ru_msgsnd;
  rusage->ru_msgrcv = usage.ru_msgrcv;
  rusage->ru_nsignals = usage.ru_nsignals;
  rusage->ru_nvcsw = usage.ru_nvcsw;
  rusage->ru_nivcsw = usage.ru_nivcsw;
#endif

  return 0;
}